

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

SPVFuncImpl __thiscall
spirv_cross::CompilerMSL::OpCodePreprocessor::get_spv_func_impl
          (OpCodePreprocessor *this,Op opcode,uint32_t *args,uint32_t length)

{
  uint32_t uVar1;
  bool bVar2;
  iterator iVar3;
  SPIRVariable *pSVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  SPIRType *pSVar7;
  SPIRExtension *pSVar8;
  SPVFuncImpl SVar9;
  
  if ((int)opcode < 0x150) {
    if ((int)opcode < 0xe3) {
      if (0x73 < (int)opcode) {
        switch(opcode) {
        case OpFAdd:
        case OpFSub:
          if (((this->compiler->msl_options).invariant_float_math == false) &&
             (bVar2 = Compiler::has_decoration
                                ((Compiler *)this->compiler,(ID)args[1],DecorationNoContraction),
             !bVar2)) {
            return SPVFuncImplNone;
          }
          return opcode == OpFAdd ^ SPVFuncImplFSub;
        case OpISub:
        case OpIMul:
        case OpUDiv:
        case OpSDiv:
        case OpFDiv:
        case OpUMod:
        case OpSRem:
        case OpSMod:
        case OpFRem:
        case OpVectorTimesScalar:
        case OpMatrixTimesScalar:
        case OpDot:
        case OpIAddCarry:
        case OpISubBorrow:
          return SPVFuncImplNone;
        case OpFMul:
        case OpVectorTimesMatrix:
        case OpMatrixTimesVector:
        case OpMatrixTimesMatrix:
        case OpOuterProduct:
          goto switchD_002383dd_caseD_85;
        case OpFMod:
          return SPVFuncImplMod;
        case OpUMulExtended:
        case OpSMulExtended:
          return SPVFuncImplMulExtended;
        default:
          if (opcode != OpQuantizeToF16) {
            return SPVFuncImplNone;
          }
          return SPVFuncImplQuantizeToF16;
        }
      }
      if ((int)opcode < 0x62) {
        if (opcode == OpExtInst) {
          pSVar8 = Variant::get<spirv_cross::SPIRExtension>
                             ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr + args[2]);
          if (*(int *)&(pSVar8->super_IVariant).field_0xc != 1) {
            return SPVFuncImplNone;
          }
          uVar1 = args[3];
          if ((int)uVar1 < 0x22) {
            if (uVar1 == 7) {
              return SPVFuncImplSSign;
            }
            if (uVar1 != 0xb) {
              if (uVar1 != 0xc) {
                return SPVFuncImplNone;
              }
              return SPVFuncImplDegrees;
            }
            return SPVFuncImplRadians;
          }
          switch(uVar1) {
          case 0x46:
            pSVar7 = Variant::get<spirv_cross::SPIRType>
                               ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr + *args);
            SVar9 = SPVFuncImplFaceForwardScalar;
            break;
          case 0x47:
            pSVar7 = Variant::get<spirv_cross::SPIRType>
                               ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr + *args);
            SVar9 = SPVFuncImplReflectScalar;
            break;
          case 0x48:
            pSVar7 = Variant::get<spirv_cross::SPIRType>
                               ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr + *args);
            SVar9 = SPVFuncImplRefractScalar;
            break;
          case 0x49:
            return SPVFuncImplFindILsb;
          case 0x4a:
            return SPVFuncImplFindSMsb;
          case 0x4b:
            return SPVFuncImplFindUMsb;
          default:
            if (uVar1 != 0x22) {
              return SPVFuncImplNone;
            }
            pSVar7 = Variant::get<spirv_cross::SPIRType>
                               ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr + *args);
            if (4 < pSVar7->columns) {
              return SPVFuncImplNone;
            }
            return (SPVFuncImpl)(0x1415160000 >> ((byte)(pSVar7->columns << 3) & 0x3f));
          }
          if (pSVar7->vecsize != 1) {
            return SPVFuncImplNone;
          }
          return SVar9;
        }
        if (opcode == OpTypeArray) {
          return SPVFuncImplUnsafeArray;
        }
        if (opcode != OpImageFetch) {
          return SPVFuncImplNone;
        }
      }
      else if (1 < opcode - OpImageRead) {
        return SPVFuncImplNone;
      }
      pmVar6 = ::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->result_types,args + (ulong)(opcode != OpImageWrite) * 2);
      if ((ulong)*pmVar6 == 0) {
        return SPVFuncImplNone;
      }
      pSVar7 = Variant::get<spirv_cross::SPIRType>
                         ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + *pmVar6);
      if ((pSVar7->image).dim != DimBuffer) {
        return SPVFuncImplNone;
      }
      if ((this->compiler->msl_options).texture_buffer_native != false) {
        return SPVFuncImplNone;
      }
      return SPVFuncImplTexelBufferCoords;
    }
    if (0xf < opcode - OpAtomicLoad) {
      return SPVFuncImplNone;
    }
  }
  else {
    if ((int)opcode < 0x1162) {
      switch(opcode) {
      case OpGroupNonUniformAllEqual:
LAB_0023877b:
        return SPVFuncImplSubgroupAllEqual;
      case OpGroupNonUniformBroadcast:
LAB_0023877b:
        return SPVFuncImplSubgroupBroadcast;
      case OpGroupNonUniformBroadcastFirst:
LAB_0023877b:
        return SPVFuncImplSubgroupBroadcastFirst;
      case OpGroupNonUniformBallot:
LAB_0023877b:
        return SPVFuncImplSubgroupBallot;
      case OpGroupNonUniformInverseBallot:
      case OpGroupNonUniformBallotBitExtract:
        return SPVFuncImplSubgroupBallotBitExtract;
      case OpGroupNonUniformBallotBitCount:
        return SPVFuncImplSubgroupBallotBitCount;
      case OpGroupNonUniformBallotFindLSB:
        return SPVFuncImplSubgroupBallotFindLSB;
      case OpGroupNonUniformBallotFindMSB:
        return SPVFuncImplSubgroupBallotFindMSB;
      case OpGroupNonUniformShuffle:
        return SPVFuncImplSubgroupShuffle;
      case OpGroupNonUniformShuffleXor:
        return SPVFuncImplSubgroupShuffleXor;
      case OpGroupNonUniformShuffleUp:
        return SPVFuncImplSubgroupShuffleUp;
      case OpGroupNonUniformShuffleDown:
        return SPVFuncImplSubgroupShuffleDown;
      case OpGroupNonUniformIAdd:
      case OpGroupNonUniformFAdd:
      case OpGroupNonUniformIMul:
      case OpGroupNonUniformFMul:
      case OpGroupNonUniformSMin:
      case OpGroupNonUniformUMin:
      case OpGroupNonUniformFMin:
      case OpGroupNonUniformSMax:
      case OpGroupNonUniformUMax:
      case OpGroupNonUniformFMax:
      case OpGroupNonUniformBitwiseAnd:
      case OpGroupNonUniformBitwiseOr:
      case OpGroupNonUniformBitwiseXor:
      case OpGroupNonUniformLogicalAnd:
      case OpGroupNonUniformLogicalOr:
      case OpGroupNonUniformLogicalXor:
        return SPVFuncImplNone;
      case OpGroupNonUniformQuadBroadcast:
        return SPVFuncImplQuadBroadcast;
      case OpGroupNonUniformQuadSwap:
        return SPVFuncImplQuadSwap;
      }
      switch(opcode) {
      case OpSubgroupBallotKHR:
        goto LAB_0023877b;
      case OpSubgroupFirstInvocationKHR:
        goto LAB_0023877b;
      default:
        return SPVFuncImplNone;
      case OpSubgroupAllEqualKHR:
        goto LAB_0023877b;
      case OpGroupNonUniformRotateKHR:
        return (length < 6) * '\x04' + SPVFuncImplSubgroupShuffle;
      case OpSubgroupReadInvocationKHR:
        goto LAB_0023877b;
      }
    }
    if (opcode - OpSDot < 6) {
      return SPVFuncImplReduceAdd;
    }
    if (opcode - OpAssumeTrueKHR < 2) {
      return SPVFuncImplAssume;
    }
    if (opcode != OpAtomicFAddEXT) {
      return SPVFuncImplNone;
    }
  }
  iVar3 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->image_pointers_emulated)._M_h,args + (ulong)(opcode != OpAtomicStore) * 2);
  if (iVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur !=
      (__node_type *)0x0) {
    pSVar4 = Variant::get<spirv_cross::SPIRVariable>
                       ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)((long)iVar3.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                        ._M_cur + 0xc));
    uVar5 = (ulong)*(uint *)&(pSVar4->super_IVariant).field_0xc;
    if ((uVar5 != 0) &&
       (pSVar7 = Variant::get<spirv_cross::SPIRType>
                           ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr + uVar5),
       (pSVar7->image).dim == Dim2D)) {
      return SPVFuncImplImage2DAtomicCoords;
    }
  }
  return SPVFuncImplNone;
switchD_002383dd_caseD_85:
  if ((this->compiler->msl_options).invariant_float_math != false) {
    return SPVFuncImplFMul;
  }
  bVar2 = Compiler::has_decoration((Compiler *)this->compiler,(ID)args[1],DecorationNoContraction);
  if (!bVar2) {
    return SPVFuncImplNone;
  }
  return SPVFuncImplFMul;
}

Assistant:

CompilerMSL::SPVFuncImpl CompilerMSL::OpCodePreprocessor::get_spv_func_impl(Op opcode, const uint32_t *args, uint32_t length)
{
	switch (opcode)
	{
	case OpFMod:
		return SPVFuncImplMod;

	case OpFAdd:
	case OpFSub:
		if (compiler.msl_options.invariant_float_math ||
		    compiler.has_decoration(args[1], DecorationNoContraction))
		{
			return opcode == OpFAdd ? SPVFuncImplFAdd : SPVFuncImplFSub;
		}
		break;

	case OpFMul:
	case OpOuterProduct:
	case OpMatrixTimesVector:
	case OpVectorTimesMatrix:
	case OpMatrixTimesMatrix:
		if (compiler.msl_options.invariant_float_math ||
		    compiler.has_decoration(args[1], DecorationNoContraction))
		{
			return SPVFuncImplFMul;
		}
		break;

	case OpQuantizeToF16:
		return SPVFuncImplQuantizeToF16;

	case OpTypeArray:
	{
		// Allow Metal to use the array<T> template to make arrays a value type
		return SPVFuncImplUnsafeArray;
	}

	// Emulate texture2D atomic operations
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicFAddEXT:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	case OpAtomicLoad:
	case OpAtomicStore:
	{
		auto it = image_pointers_emulated.find(args[opcode == OpAtomicStore ? 0 : 2]);
		if (it != image_pointers_emulated.end())
		{
			uint32_t tid = compiler.get<SPIRVariable>(it->second).basetype;
			if (tid && compiler.get<SPIRType>(tid).image.dim == Dim2D)
				return SPVFuncImplImage2DAtomicCoords;
		}
		break;
	}

	case OpImageFetch:
	case OpImageRead:
	case OpImageWrite:
	{
		// Retrieve the image type, and if it's a Buffer, emit a texel coordinate function
		uint32_t tid = result_types[args[opcode == OpImageWrite ? 0 : 2]];
		if (tid && compiler.get<SPIRType>(tid).image.dim == DimBuffer && !compiler.msl_options.texture_buffer_native)
			return SPVFuncImplTexelBufferCoords;
		break;
	}

	case OpExtInst:
	{
		uint32_t extension_set = args[2];
		if (compiler.get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
		{
			auto op_450 = static_cast<GLSLstd450>(args[3]);
			switch (op_450)
			{
			case GLSLstd450Radians:
				return SPVFuncImplRadians;
			case GLSLstd450Degrees:
				return SPVFuncImplDegrees;
			case GLSLstd450FindILsb:
				return SPVFuncImplFindILsb;
			case GLSLstd450FindSMsb:
				return SPVFuncImplFindSMsb;
			case GLSLstd450FindUMsb:
				return SPVFuncImplFindUMsb;
			case GLSLstd450SSign:
				return SPVFuncImplSSign;
			case GLSLstd450Reflect:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplReflectScalar;
				break;
			}
			case GLSLstd450Refract:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplRefractScalar;
				break;
			}
			case GLSLstd450FaceForward:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplFaceForwardScalar;
				break;
			}
			case GLSLstd450MatrixInverse:
			{
				auto &mat_type = compiler.get<SPIRType>(args[0]);
				switch (mat_type.columns)
				{
				case 2:
					return SPVFuncImplInverse2x2;
				case 3:
					return SPVFuncImplInverse3x3;
				case 4:
					return SPVFuncImplInverse4x4;
				default:
					break;
				}
				break;
			}
			default:
				break;
			}
		}
		break;
	}

	case OpGroupNonUniformBroadcast:
	case OpSubgroupReadInvocationKHR:
		return SPVFuncImplSubgroupBroadcast;

	case OpGroupNonUniformBroadcastFirst:
	case OpSubgroupFirstInvocationKHR:
		return SPVFuncImplSubgroupBroadcastFirst;

	case OpGroupNonUniformBallot:
	case OpSubgroupBallotKHR:
		return SPVFuncImplSubgroupBallot;

	case OpGroupNonUniformInverseBallot:
	case OpGroupNonUniformBallotBitExtract:
		return SPVFuncImplSubgroupBallotBitExtract;

	case OpGroupNonUniformBallotFindLSB:
		return SPVFuncImplSubgroupBallotFindLSB;

	case OpGroupNonUniformBallotFindMSB:
		return SPVFuncImplSubgroupBallotFindMSB;

	case OpGroupNonUniformBallotBitCount:
		return SPVFuncImplSubgroupBallotBitCount;

	case OpGroupNonUniformAllEqual:
	case OpSubgroupAllEqualKHR:
		return SPVFuncImplSubgroupAllEqual;

	case OpGroupNonUniformShuffle:
		return SPVFuncImplSubgroupShuffle;

	case OpGroupNonUniformShuffleXor:
		return SPVFuncImplSubgroupShuffleXor;

	case OpGroupNonUniformShuffleUp:
		return SPVFuncImplSubgroupShuffleUp;

	case OpGroupNonUniformShuffleDown:
		return SPVFuncImplSubgroupShuffleDown;

	case OpGroupNonUniformRotateKHR:
		// Clustered rotate is performed using shuffle.
		if (length > 5)
			return SPVFuncImplSubgroupShuffle;
		return SPVFuncImplSubgroupRotate;

	case OpGroupNonUniformQuadBroadcast:
		return SPVFuncImplQuadBroadcast;

	case OpGroupNonUniformQuadSwap:
		return SPVFuncImplQuadSwap;

	case OpSDot:
	case OpUDot:
	case OpSUDot:
	case OpSDotAccSat:
	case OpUDotAccSat:
	case OpSUDotAccSat:
		return SPVFuncImplReduceAdd;

	case OpSMulExtended:
	case OpUMulExtended:
		return SPVFuncImplMulExtended;

	case OpAssumeTrueKHR:
	case OpExpectKHR:
		return SPVFuncImplAssume;

	default:
		break;
	}
	return SPVFuncImplNone;
}